

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O3

REF_STATUS
ref_geom_bspline_eval
          (REF_INT degree,REF_INT n_control_point,REF_DBL *knots,REF_DBL t,REF_DBL *control_points,
          REF_DBL *val)

{
  REF_STATUS RVar1;
  ulong uVar2;
  int iVar3;
  undefined8 uVar4;
  char *pcVar5;
  REF_INT span;
  REF_DBL N [16];
  int local_bc;
  REF_DBL local_b8 [17];
  
  *val = 0.0;
  if (degree < 0x10) {
    ref_geom_bspline_span_index(degree,n_control_point,knots,t,&local_bc);
    RVar1 = ref_geom_bspline_basis(degree,knots,t,local_bc,local_b8);
    if (RVar1 == 0) {
      if (-1 < degree) {
        uVar2 = 0;
        do {
          iVar3 = (local_bc - degree) + (int)uVar2;
          if (iVar3 < 0) {
            pcVar5 = "point negative";
            uVar4 = 0x10ff;
            goto LAB_00152260;
          }
          if (n_control_point <= iVar3) {
            pcVar5 = "point >= n_control_point";
            uVar4 = 0x1100;
            goto LAB_00152260;
          }
          *val = local_b8[uVar2] * control_points[(uint)(local_bc - degree) + uVar2] + *val;
          uVar2 = uVar2 + 1;
        } while (degree + 1 != uVar2);
      }
      RVar1 = 0;
    }
    else {
      RVar1 = 1;
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x10fc
             ,"ref_geom_bspline_eval",1,"basis");
    }
  }
  else {
    pcVar5 = "temp variables sized smaller than degree";
    uVar4 = 0x10f9;
LAB_00152260:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",uVar4,
           "ref_geom_bspline_eval",pcVar5);
    RVar1 = 1;
  }
  return RVar1;
}

Assistant:

REF_FCN REF_STATUS ref_geom_bspline_eval(REF_INT degree,
                                         REF_INT n_control_point,
                                         REF_DBL *knots, REF_DBL t,
                                         REF_DBL *control_points,
                                         REF_DBL *val) {
  REF_INT span;
  REF_DBL N[16];
  REF_INT i, point;
  *val = 0.0;
  RAS(degree < 16, "temp variables sized smaller than degree");
  RSS(ref_geom_bspline_span_index(degree, n_control_point, knots, t, &span),
      "index");
  RSS(ref_geom_bspline_basis(degree, knots, t, span, N), "basis");
  for (i = 0; i < degree + 1; i++) {
    point = span - degree + i;
    RAS(point >= 0, "point negative");
    RAS(point < n_control_point, "point >= n_control_point");
    (*val) += N[i] * control_points[point];
  }
  return REF_SUCCESS;
}